

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gram.c
# Opt level: O0

int build_grammar(Grammar *g)

{
  Grammar *g_local;
  
  resolve_grammar(g);
  convert_regex_productions(g);
  convert_priorities(g);
  propogate_declarations(g);
  merge_identical_terminals(g);
  make_elems_for_productions(g);
  check_default_actions(g);
  build_LR_tables(g);
  map_declarations_to_states(g);
  if (d_verbose_level != 0) {
    printf("%d productions %d terminals %d states %d declarations\n",(ulong)(g->productions).n,
           (ulong)(g->terminals).n,(ulong)(g->states).n,(ulong)(g->declarations).n);
  }
  if (1 < d_verbose_level) {
    print_grammar(g);
    print_states(g);
  }
  build_scanners(g);
  build_eq(g);
  return 0;
}

Assistant:

int build_grammar(Grammar *g) {
  resolve_grammar(g);
  convert_regex_productions(g);
  convert_priorities(g);
  propogate_declarations(g);
  merge_identical_terminals(g);
  make_elems_for_productions(g);
  check_default_actions(g);
  build_LR_tables(g);
  map_declarations_to_states(g);
  if (d_verbose_level) {
    printf("%d productions %d terminals %d states %d declarations\n", g->productions.n, g->terminals.n, g->states.n,
           g->declarations.n);
  }
  if (d_verbose_level > 1) {
    print_grammar(g);
    print_states(g);
  }
  build_scanners(g);
  build_eq(g);
  return 0;
}